

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void __thiscall
duckdb::RLECompressState<duckdb::uhugeint_t,_true>::FlushSegment
          (RLECompressState<duckdb::uhugeint_t,_true> *this)

{
  idx_t iVar1;
  idx_t iVar2;
  long *plVar3;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var4;
  ColumnCheckpointState *pCVar5;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_60;
  size_t local_58;
  long local_50;
  BufferHandle local_48;
  
  iVar1 = this->entry_count;
  iVar2 = this->max_rle_count;
  local_58 = iVar1 * 2;
  local_50 = iVar1 * 0x12 + 8;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  plVar3 = (long *)((this->handle).node.ptr)->buffer;
  memmove(plVar3 + iVar1 * 2 + 1,plVar3 + iVar2 * 2 + 1,local_58);
  *plVar3 = iVar1 * 0x10 + 8;
  BufferHandle::Destroy(&this->handle);
  pCVar5 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  local_60._M_head_impl =
       (this->current_segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&local_48,&this->handle);
  (*pCVar5->_vptr_ColumnCheckpointState[4])(pCVar5,&local_60,&local_48,local_50);
  BufferHandle::~BufferHandle(&local_48);
  _Var4._M_head_impl = local_60._M_head_impl;
  if (local_60._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_60._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  return;
}

Assistant:

void FlushSegment() {
		// flush the segment
		// we compact the segment by moving the counts so they are directly next to the values
		idx_t counts_size = sizeof(rle_count_t) * entry_count;
		idx_t original_rle_offset = RLEConstants::RLE_HEADER_SIZE + max_rle_count * sizeof(T);
		idx_t minimal_rle_offset = RLEConstants::RLE_HEADER_SIZE + sizeof(T) * entry_count;
		idx_t aligned_rle_offset = AlignValue(minimal_rle_offset);
		idx_t total_segment_size = aligned_rle_offset + counts_size;
		auto data_ptr = handle.Ptr();
		if (aligned_rle_offset > minimal_rle_offset) {
			memset(data_ptr + minimal_rle_offset, 0, aligned_rle_offset - minimal_rle_offset);
		}
		memmove(data_ptr + aligned_rle_offset, data_ptr + original_rle_offset, counts_size);
		// store the final RLE offset within the segment
		Store<uint64_t>(aligned_rle_offset, data_ptr);
		handle.Destroy();

		auto &state = checkpoint_data.GetCheckpointState();
		state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
	}